

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O2

_Bool getPrimaries(khr_df_primaries_e primaries,Primaries *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  sPrimaryMapping *psVar8;
  ulong uVar9;
  sPrimaryMapping *psVar10;
  ulong uVar11;
  
  psVar8 = primaryMap;
  uVar9 = 0;
  do {
    uVar11 = uVar9;
    psVar10 = psVar8;
    if (uVar11 == 0xb) goto LAB_001e7b72;
    psVar8 = psVar10 + 1;
    uVar9 = uVar11 + 1;
  } while (psVar10->dfPrimaryEnum != primaries);
  fVar4 = (psVar10->primaries).Rx;
  fVar5 = (psVar10->primaries).Ry;
  fVar6 = (psVar10->primaries).Gx;
  fVar7 = (psVar10->primaries).Gy;
  fVar1 = (psVar10->primaries).By;
  fVar2 = (psVar10->primaries).Wx;
  fVar3 = (psVar10->primaries).Wy;
  p->Bx = (psVar10->primaries).Bx;
  p->By = fVar1;
  p->Wx = fVar2;
  p->Wy = fVar3;
  p->Rx = fVar4;
  p->Ry = fVar5;
  p->Gx = fVar6;
  p->Gy = fVar7;
LAB_001e7b72:
  return uVar11 < 0xb;
}

Assistant:

bool getPrimaries(khr_df_primaries_e primaries, Primaries *p) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].dfPrimaryEnum == primaries) {
            *p = primaryMap[i].primaries;
            return true;
        }
    }

    /* No match */
    return false;
}